

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::GetLibraryNames
          (cmTarget *this,string *name,string *soName,string *realName,string *impName,
          string *pdbName,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  string *vName;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *version;
  long *plVar5;
  size_type *psVar6;
  char *version_00;
  string prefix;
  string base;
  string suffix;
  string local_f8;
  string local_d8;
  string local_b8;
  string *local_98;
  string *local_90;
  string *local_88;
  string local_80;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = name;
  if (this->IsImportedTarget == true) {
    local_b8._M_dataplus._M_p = (pointer)0x2b;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_b8);
    local_f8.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1b) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1c) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1d) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1e) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1f) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x20) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x21) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x22) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x23) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x24) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x25) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x26) = 'g';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x27) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x28) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x29) = ':';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x2a) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x10) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x11) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x12) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x13) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x14) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x15) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x16) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x17) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x18) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x19) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1a) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1b) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1c) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1d) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1e) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0x1f) = 't';
    *(undefined8 *)local_f8._M_dataplus._M_p = 0x617262694c746547;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 8) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 9) = 'y';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 10) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0xb) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0xc) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0xd) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p + 0xf) = ' ';
    local_f8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
    local_f8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(this->Name)._M_dataplus._M_p);
    cmMakefile::IssueMessage(this->Makefile,INTERNAL_ERROR,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      return;
    }
  }
  else {
    local_88 = impName;
    local_60 = pdbName;
    if (this->TargetTypeValue == INTERFACE_LIBRARY) {
      __assert_fail("this->GetType() != INTERFACE_LIBRARY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                    ,0xfaf,
                    "void cmTarget::GetLibraryNames(std::string &, std::string &, std::string &, std::string &, std::string &, const std::string &) const"
                   );
    }
    paVar1 = &local_f8.field_2;
    local_f8._M_string_length = 7;
    local_f8.field_2._M_allocated_capacity = 0x4e4f4953524556;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    pcVar4 = GetProperty(this,&local_f8,this->Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8.field_2._M_allocated_capacity = 0x4f49535245564f53;
    local_f8.field_2._8_2_ = 0x4e;
    local_f8._M_string_length = 9;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    local_90 = soName;
    version = GetProperty(this,&local_f8,this->Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    bVar2 = HasSOName(this,config);
    if (bVar2) {
      this_00 = this->Makefile;
      local_b8._M_dataplus._M_p = (pointer)0x22;
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      local_f8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_b8);
      local_f8.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
      builtin_strncpy(local_f8._M_dataplus._M_p,"CMAKE_PLATFORM_NO_VERSIONED_SONAME",0x22);
      local_f8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
      local_f8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
      bVar2 = cmMakefile::IsOn(this_00,&local_f8);
      bVar3 = true;
      if (!bVar2) {
        bVar3 = IsFrameworkOnApple(this);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      if (bVar3 != false) {
        pcVar4 = (char *)0x0;
        version = (char *)0x0;
      }
    }
    else {
      pcVar4 = (char *)0x0;
      version = (char *)0x0;
    }
    version_00 = pcVar4;
    if (version != (char *)0x0) {
      version_00 = version;
    }
    if (pcVar4 == (char *)0x0) {
      version_00 = version;
    }
    if (version_00 == (char *)0x0) {
      version = pcVar4;
    }
    if (pcVar4 != (char *)0x0) {
      version = pcVar4;
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity =
         local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    GetFullNameInternal(this,config,false,&local_f8,&local_b8,&local_80);
    std::operator+(&local_50,&local_f8,&local_b8);
    local_58 = realName;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,(ulong)local_80._M_dataplus._M_p);
    paVar1 = &local_d8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar5[3];
      local_d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    vName = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar2 = IsFrameworkOnApple(this);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)vName);
      std::__cxx11::string::append((char *)vName);
      GetFrameworkVersion_abi_cxx11_(&local_d8,this);
      std::__cxx11::string::_M_append((char *)vName,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)vName);
      std::__cxx11::string::_M_append((char *)vName,(ulong)local_b8._M_dataplus._M_p);
      std::__cxx11::string::_M_assign((string *)local_90);
    }
    else {
      ComputeVersionedName(this,local_90,&local_f8,&local_b8,&local_80,local_98,version_00);
      ComputeVersionedName(this,vName,&local_f8,&local_b8,&local_80,local_98,version);
    }
    if ((this->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
      GetFullNameInternal(&local_d8,this,config,true);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)local_88,0,(char *)local_88->_M_string_length,0x5e12e9);
    }
    GetPDBName(&local_d8,this,config);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      return;
    }
  }
  operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  return;
}

Assistant:

void cmTarget::GetLibraryNames(std::string& name,
                               std::string& soName,
                               std::string& realName,
                               std::string& impName,
                               std::string& pdbName,
                               const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if(this->IsImported())
    {
    std::string msg =  "GetLibraryNames called on imported target: ";
    msg += this->GetName();
    this->Makefile->IssueMessage(cmake::INTERNAL_ERROR,
                                 msg);
    return;
    }

  assert(this->GetType() != INTERFACE_LIBRARY);

  // Check for library version properties.
  const char* version = this->GetProperty("VERSION");
  const char* soversion = this->GetProperty("SOVERSION");
  if(!this->HasSOName(config) ||
     this->Makefile->IsOn("CMAKE_PLATFORM_NO_VERSIONED_SONAME") ||
     this->IsFrameworkOnApple())
    {
    // Versioning is supported only for shared libraries and modules,
    // and then only when the platform supports an soname flag.
    version = 0;
    soversion = 0;
    }
  if(version && !soversion)
    {
    // The soversion must be set if the library version is set.  Use
    // the library version as the soversion.
    soversion = version;
    }
  if(!version && soversion)
    {
    // Use the soversion as the library version.
    version = soversion;
    }

  // Get the components of the library name.
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, false, prefix, base, suffix);

  // The library name.
  name = prefix+base+suffix;

  if(this->IsFrameworkOnApple())
    {
    realName = prefix;
    realName += "Versions/";
    realName += this->GetFrameworkVersion();
    realName += "/";
    realName += base;
    soName = realName;
    }
  else
    {
    // The library's soname.
    this->ComputeVersionedName(soName, prefix, base, suffix,
                               name, soversion);
    // The library's real name on disk.
    this->ComputeVersionedName(realName, prefix, base, suffix,
                               name, version);
    }

  // The import library name.
  if(this->GetType() == cmTarget::SHARED_LIBRARY ||
     this->GetType() == cmTarget::MODULE_LIBRARY)
    {
    impName = this->GetFullNameInternal(config, true);
    }
  else
    {
    impName = "";
    }

  // The program database file name.
  pdbName = this->GetPDBName(config);
}